

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransportamqp_methods.c
# Opt level: O1

AMQP_VALUE on_message_received(void *context,MESSAGE_HANDLE message)

{
  uint64_t uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  LOGGER_LOG p_Var6;
  AMQP_VALUE pAVar7;
  AMQP_VALUE key;
  AMQP_VALUE value;
  AMQP_VALUE key_00;
  LIST_ITEM_HANDLE item_handle;
  undefined8 *puVar8;
  uint64_t uVar9;
  char *pcVar10;
  char cVar11;
  int32_t status_code;
  char *status_description;
  PROPERTIES_HANDLE response_properties;
  AMQP_VALUE application_properties;
  uint64_t correlation_id;
  AMQP_VALUE correlation_id_value;
  int local_84;
  char *local_80;
  uint64_t local_78;
  PROPERTIES_HANDLE local_70;
  AMQP_VALUE local_68;
  AMQP_VALUE local_60;
  AMQP_VALUE local_58;
  AMQP_VALUE local_50;
  AMQP_VALUE local_48;
  uint64_t local_40;
  AMQP_VALUE local_38;
  
  if (context == (void *)0x0) {
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 != (LOGGER_LOG)0x0) {
      (*p_Var6)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                ,"on_message_received",0x49,1,"NULL context in on_message_received");
      return (AMQP_VALUE)0x0;
    }
    return (AMQP_VALUE)0x0;
  }
  iVar4 = message_get_application_properties(message,&local_68);
  if (iVar4 != 0) {
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 != (LOGGER_LOG)0x0) {
      (*p_Var6)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                ,"on_message_received",0x55,1,"Could not retrieve application properties");
    }
    (**(code **)((long)context + 0x40))(*(undefined8 *)((long)context + 0x48));
    pAVar7 = messaging_delivery_rejected
                       ("amqp:internal-error",
                        "Could not get application properties on AMQP management response.");
    return pAVar7;
  }
  iVar4 = message_get_properties(message,&local_70);
  if (iVar4 != 0) {
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 != (LOGGER_LOG)0x0) {
      (*p_Var6)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                ,"on_message_received",0x62,1,"Could not retrieve message properties");
    }
    (**(code **)((long)context + 0x40))(*(undefined8 *)((long)context + 0x48));
    pAVar7 = messaging_delivery_rejected
                       ("amqp:internal-error",
                        "Could not get message properties on AMQP management response.");
    goto LAB_001750ed;
  }
  iVar4 = properties_get_correlation_id(local_70,&local_38);
  if (iVar4 == 0) {
    iVar4 = amqpvalue_get_ulong(local_38,&local_40);
    if (iVar4 != 0) {
      p_Var6 = xlogging_get_log_function();
      if (p_Var6 != (LOGGER_LOG)0x0) {
        pcVar10 = "Could not retrieve correlation Id ulong value";
        iVar4 = 0x7f;
        goto LAB_001750bb;
      }
      goto LAB_001750c6;
    }
    pAVar7 = amqpvalue_get_inplace_described_value(local_68);
    if (pAVar7 == (AMQP_VALUE)0x0) {
      p_Var6 = xlogging_get_log_function();
      if (p_Var6 != (LOGGER_LOG)0x0) {
        (*p_Var6)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                  ,"on_message_received",0x8c,1,"Could not retrieve application property map");
      }
      (**(code **)((long)context + 0x40))(*(undefined8 *)((long)context + 0x48));
      pcVar10 = 
      "Could not get application property map from the application properties in the AMQP management response."
      ;
      goto LAB_001750db;
    }
    key = amqpvalue_create_string(*(char **)((long)context + 0x58));
    if (key == (AMQP_VALUE)0x0) {
      p_Var6 = xlogging_get_log_function();
      if (p_Var6 != (LOGGER_LOG)0x0) {
        (*p_Var6)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                  ,"on_message_received",0x99,1,"Could not create status-code amqp value");
      }
      (**(code **)((long)context + 0x40))(*(undefined8 *)((long)context + 0x48));
      pAVar7 = messaging_delivery_released();
    }
    else {
      value = amqpvalue_get_map_value(pAVar7,key);
      if (value == (AMQP_VALUE)0x0) {
        p_Var6 = xlogging_get_log_function();
        if (p_Var6 != (LOGGER_LOG)0x0) {
          (*p_Var6)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                    ,"on_message_received",0xa5,1,
                    "Could not retrieve status code from application properties");
        }
        (**(code **)((long)context + 0x40))(*(undefined8 *)((long)context + 0x48));
        pAVar7 = messaging_delivery_rejected
                           ("amqp:internal-error",
                            "Could not retrieve status code from the application properties in the AMQP management response."
                           );
      }
      else {
        iVar4 = amqpvalue_get_int(value,&local_84);
        if (iVar4 == 0) {
          key_00 = amqpvalue_create_string(*(char **)((long)context + 0x60));
          if (key_00 == (AMQP_VALUE)0x0) {
            p_Var6 = xlogging_get_log_function();
            if (p_Var6 != (LOGGER_LOG)0x0) {
              (*p_Var6)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                        ,"on_message_received",0xbe,1,
                        "Could not create status-description amqp value");
            }
            (**(code **)((long)context + 0x40))(*(undefined8 *)((long)context + 0x48));
            pAVar7 = messaging_delivery_released();
          }
          else {
            local_80 = (char *)0x0;
            local_58 = key_00;
            local_60 = amqpvalue_get_map_value(pAVar7,key_00);
            local_50 = value;
            local_48 = key;
            if ((local_60 == (AMQP_VALUE)0x0) ||
               (iVar4 = amqpvalue_get_string(local_60,&local_80), iVar4 != 0)) {
              local_80 = (char *)0x0;
            }
            item_handle = singlylinkedlist_get_head_item
                                    (*(SINGLYLINKEDLIST_HANDLE *)((long)context + 0x20));
            bVar2 = false;
            bVar3 = false;
            do {
              if (item_handle == (LIST_ITEM_HANDLE)0x0) break;
              puVar8 = (undefined8 *)singlylinkedlist_item_get_value(item_handle);
              if (puVar8 == (undefined8 *)0x0) {
                p_Var6 = xlogging_get_log_function();
                if (p_Var6 != (LOGGER_LOG)0x0) {
                  (*p_Var6)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                            ,"on_message_received",0xe3,1,
                            "Could not create status-description amqp value");
                }
                (**(code **)((long)context + 0x40))();
                messaging_delivery_released();
                iVar4 = 0x17;
              }
              else {
                uVar1 = puVar8[2];
                iVar4 = 0;
                uVar9 = local_40;
                if (local_40 == uVar1) {
                  local_78 = local_40;
                  if (*(char *)(puVar8 + 3) == '\0') {
                    p_Var6 = xlogging_get_log_function();
                    if (p_Var6 != (LOGGER_LOG)0x0) {
                      (*p_Var6)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                                ,"on_message_received",0xf4,1,
                                "Did not receive send confirmation for pending operation");
                    }
                    iVar4 = async_operation_cancel((ASYNC_OPERATION_HANDLE)puVar8[5]);
                    cVar11 = '\x03';
                    if (iVar4 != 0) {
                      p_Var6 = xlogging_get_log_function();
                      bVar2 = true;
                      if (p_Var6 != (LOGGER_LOG)0x0) {
                        (*p_Var6)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                                  ,"on_message_received",0xf9,1,
                                  "Failed cancelling pending send operation");
                      }
                    }
                  }
                  else {
                    cVar11 = (local_84 - 300U < 0xffffff9c) * '\x02' + '\x01';
                  }
                  if ((code *)*puVar8 != (code *)0x0) {
                    (*(code *)*puVar8)(puVar8[1],cVar11,local_84,local_80,message);
                  }
                  async_operation_destroy((ASYNC_OPERATION_HANDLE)puVar8[6]);
                  iVar5 = singlylinkedlist_remove
                                    (*(SINGLYLINKEDLIST_HANDLE *)((long)context + 0x20),item_handle)
                  ;
                  iVar4 = 0x17;
                  if (iVar5 == 0) {
                    bVar3 = true;
                    uVar9 = local_78;
                  }
                  else {
                    p_Var6 = xlogging_get_log_function();
                    bVar2 = true;
                    uVar9 = local_78;
                    if (p_Var6 != (LOGGER_LOG)0x0) {
                      (*p_Var6)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                                ,"on_message_received",0x117,1,"Cannot remove pending operation");
                      uVar9 = local_78;
                    }
                  }
                }
                if (uVar9 != uVar1) {
                  item_handle = singlylinkedlist_get_next_item(item_handle);
                  iVar4 = 0;
                }
              }
            } while (iVar4 == 0);
            key = local_48;
            value = local_50;
            if (bVar2) {
              (**(code **)((long)context + 0x40))(*(undefined8 *)((long)context + 0x48));
              pAVar7 = messaging_delivery_released();
            }
            else if (bVar3) {
              pAVar7 = messaging_delivery_accepted();
            }
            else {
              p_Var6 = xlogging_get_log_function();
              if (p_Var6 != (LOGGER_LOG)0x0) {
                (*p_Var6)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                          ,"on_message_received",0x134,1,
                          "Could not match AMQP management response to request");
              }
              (**(code **)((long)context + 0x40))(*(undefined8 *)((long)context + 0x48));
              pAVar7 = messaging_delivery_rejected
                                 ("amqp:internal-error",
                                  "Could not match AMQP management response to request");
            }
            if (local_60 != (AMQP_VALUE)0x0) {
              amqpvalue_destroy(local_60);
            }
            amqpvalue_destroy(local_58);
          }
        }
        else {
          p_Var6 = xlogging_get_log_function();
          if (p_Var6 != (LOGGER_LOG)0x0) {
            (*p_Var6)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                      ,"on_message_received",0xb1,1,"Could not retrieve status code int value");
          }
          (**(code **)((long)context + 0x40))(*(undefined8 *)((long)context + 0x48));
          pAVar7 = messaging_delivery_rejected
                             ("amqp:internal-error",
                              "Could not retrieve status code value from the application properties in the AMQP management response."
                             );
        }
        amqpvalue_destroy(value);
      }
      amqpvalue_destroy(key);
    }
  }
  else {
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 != (LOGGER_LOG)0x0) {
      pcVar10 = "Could not retrieve correlation Id";
      iVar4 = 0x75;
LAB_001750bb:
      (*p_Var6)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_management.c"
                ,"on_message_received",iVar4,1,pcVar10);
    }
LAB_001750c6:
    (**(code **)((long)context + 0x40))(*(undefined8 *)((long)context + 0x48));
    pcVar10 = "Could not get correlation Id from AMQP management response.";
LAB_001750db:
    pAVar7 = messaging_delivery_rejected("amqp:internal-error",pcVar10);
  }
  properties_destroy(local_70);
LAB_001750ed:
  amqpvalue_destroy(local_68);
  return pAVar7;
}

Assistant:

static AMQP_VALUE on_message_received(const void* context, MESSAGE_HANDLE message)
{
    PROPERTIES_HANDLE properties;
    /* VS believes this is not initialized, so have to set it to the worse case here */
    AMQP_VALUE result = NULL;
    IOTHUBTRANSPORT_AMQP_METHODS_HANDLE amqp_methods_handle = (IOTHUBTRANSPORT_AMQP_METHODS_HANDLE)context;
    MESSAGE_OUTCOME message_outcome;

    if (message == NULL)
    {
        LogError("NULL message");
        message_outcome = MESSAGE_OUTCOME_RELEASED;
    }
    else
    {
        if (message_get_properties(message, &properties) != 0)
        {
            LogError("Cannot retrieve message properties");
            message_outcome = MESSAGE_OUTCOME_REJECTED;
            result = messaging_delivery_rejected("amqp:decode-error", "Cannot retrieve message properties");
        }
        else
        {
            AMQP_VALUE correlation_id;

            if (properties_get_correlation_id(properties, &correlation_id) != 0)
            {
                LogError("Cannot retrieve correlation id");
                message_outcome = MESSAGE_OUTCOME_REJECTED;
                result = messaging_delivery_rejected("amqp:decode-error", "Cannot retrieve correlation id");
            }
            else
            {
                IOTHUBTRANSPORT_AMQP_METHOD* method_handle = (IOTHUBTRANSPORT_AMQP_METHOD*)malloc(sizeof(IOTHUBTRANSPORT_AMQP_METHOD));
                if (method_handle == NULL)
                {
                    LogError("Cannot allocate method handle");
                    message_outcome = MESSAGE_OUTCOME_RELEASED;
                }
                else
                {
                    IOTHUBTRANSPORT_AMQP_METHOD_HANDLE* new_handles;
                    size_t realloc_size = safe_multiply_size_t(safe_add_size_t(amqp_methods_handle->method_request_handle_count, 1), sizeof(IOTHUBTRANSPORT_AMQP_METHOD_HANDLE));
                    if (realloc_size == SIZE_MAX || 
                        (new_handles = (IOTHUBTRANSPORT_AMQP_METHOD_HANDLE*)realloc(amqp_methods_handle->method_request_handles, realloc_size)) == NULL)
                    {
                        free(method_handle);
                        LogError("Cannot grow method handles array, size:%zu", realloc_size);
                        message_outcome = MESSAGE_OUTCOME_RELEASED;
                    }
                    else
                    {
                        amqp_methods_handle->method_request_handles = new_handles;

                        if (amqpvalue_get_uuid(correlation_id, &method_handle->correlation_id) != 0)
                        {
                            free(method_handle);
                            LogError("Cannot get uuid value for correlation-id");
                            message_outcome = MESSAGE_OUTCOME_REJECTED;
                            result = messaging_delivery_rejected("amqp:decode-error", "Cannot get uuid value for correlation-id");
                        }
                        else
                        {
                            BINARY_DATA binary_data;

                            if (message_get_body_amqp_data_in_place(message, 0, &binary_data) != 0)
                            {
                                free(method_handle);
                                LogError("Cannot get method request message payload");
                                message_outcome = MESSAGE_OUTCOME_REJECTED;
                                result = messaging_delivery_rejected("amqp:decode-error", "Cannot get method request message payload");
                            }
                            else
                            {
                                AMQP_VALUE application_properties;

                                if (message_get_application_properties(message, &application_properties) != 0)
                                {
                                    LogError("Cannot get application properties");
                                    free(method_handle);
                                    message_outcome = MESSAGE_OUTCOME_REJECTED;
                                    result = messaging_delivery_rejected("amqp:decode-error", "Cannot get application properties");
                                }
                                else
                                {
                                    AMQP_VALUE amqp_properties_map = amqpvalue_get_inplace_described_value(application_properties);
                                    if (amqp_properties_map == NULL)
                                    {
                                        LogError("Cannot get application properties map");
                                        free(method_handle);
                                        message_outcome = MESSAGE_OUTCOME_RELEASED;
                                    }
                                    else
                                    {
                                        AMQP_VALUE property_key = amqpvalue_create_string("IoThub-methodname");
                                        if (property_key == NULL)
                                        {
                                            LogError("Cannot create the property key for method name");
                                            free(method_handle);
                                            message_outcome = MESSAGE_OUTCOME_RELEASED;
                                        }
                                        else
                                        {
                                            AMQP_VALUE property_value = amqpvalue_get_map_value(amqp_properties_map, property_key);
                                            if (property_value == NULL)
                                            {
                                                LogError("Cannot find the IoThub-methodname property in the properties map");
                                                free(method_handle);
                                                message_outcome = MESSAGE_OUTCOME_REJECTED;
                                                result = messaging_delivery_rejected("amqp:decode-error", "Cannot find the IoThub-methodname property in the properties map");
                                            }
                                            else
                                            {
                                                const char* method_name;

                                                if (amqpvalue_get_string(property_value, &method_name) != 0)
                                                {
                                                    LogError("Cannot read the method name from the property value");
                                                    free(method_handle);
                                                    message_outcome = MESSAGE_OUTCOME_REJECTED;
                                                    result = messaging_delivery_rejected("amqp:decode-error", "Cannot read the method name from the property value");
                                                }
                                                else
                                                {
                                                    result = messaging_delivery_accepted();
                                                    if (result == NULL)
                                                    {
                                                        LogError("Cannot allocate memory for delivery state");
                                                        free(method_handle);
                                                        message_outcome = MESSAGE_OUTCOME_RELEASED;
                                                    }
                                                    else
                                                    {
                                                        method_handle->iothubtransport_amqp_methods_handle = amqp_methods_handle;

                                                        /* set the method request handle in the handle array */
                                                        amqp_methods_handle->method_request_handles[amqp_methods_handle->method_request_handle_count] = method_handle;
                                                        amqp_methods_handle->method_request_handle_count++;

                                                        if (amqp_methods_handle->on_method_request_received(amqp_methods_handle->on_method_request_received_context, method_name, binary_data.bytes, binary_data.length, method_handle) != 0)
                                                        {
                                                            LogError("Cannot execute the callback with the given data");
                                                            amqpvalue_destroy(result);
                                                            free(method_handle);
                                                            amqp_methods_handle->method_request_handle_count--;
                                                            message_outcome = MESSAGE_OUTCOME_REJECTED;
                                                            result = messaging_delivery_rejected("amqp:internal-error", "Cannot execute the callback with the given data");
                                                        }
                                                        else
                                                        {
                                                            message_outcome = MESSAGE_OUTCOME_ACCEPTED;
                                                        }
                                                    }
                                                }

                                                amqpvalue_destroy(property_value);
                                            }

                                            amqpvalue_destroy(property_key);
                                        }
                                    }

                                    application_properties_destroy(application_properties);
                                }
                            }
                        }
                    }
                }
            }

            properties_destroy(properties);
        }
    }

    switch (message_outcome)
    {
    default:
        break;

    case MESSAGE_OUTCOME_RELEASED:
        result = messaging_delivery_released();

        amqp_methods_handle->on_methods_error(amqp_methods_handle->on_methods_error_context);
        break;

    case MESSAGE_OUTCOME_REJECTED:
    case MESSAGE_OUTCOME_ACCEPTED:
        /* all is well */
        break;
    }

    return result;
}